

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg-ndfs.cc
# Opt level: O1

tuple<tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
* tchecker::tck_liveness::zg_ndfs::run
            (tuple<tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
             *__return_storage_ptr__,system_declaration_t *sysdecl,string *labels,size_t block_size,
            size_t table_size)

{
  bool bVar1;
  system_t *this;
  ostream *poVar2;
  graph_t *this_00;
  algorithm_t algorithm;
  shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> graph;
  shared_ptr<tchecker::zg::zg_t> zg;
  shared_ptr<const_tchecker::ta::system_t> system;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> accepting_labels;
  stats_t stats;
  algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> local_c1;
  graph_t *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  shared_ptr<tchecker::zg::zg_t> local_b0;
  shared_ptr<const_tchecker::ta::system_t> local_a0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  stats_t local_70;
  
  this = (system_t *)operator_new(0x480);
  ta::system_t::system_t(this,sysdecl);
  local_a0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::ta::system_t*>
            (&local_a0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this);
  bVar1 = tchecker::system::every_process_has_initial_location
                    ((system_t *)
                     local_a0.
                     super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (!bVar1) {
    poVar2 = tchecker::operator<<((ostream *)&std::cerr,(log_warning_t *)&log_warning);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"system has no initial state",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  local_b0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       tchecker::zg::factory
                 (&local_a0,SHARING,ELAPSED_SEMANTICS,EXTRA_LU_PLUS_LOCAL,block_size,table_size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::zg::zg_t*>
            (&local_b0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_b0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (graph_t *)operator_new(0x118);
  graph_t::graph_t(this_00,&local_b0,block_size,table_size);
  local_c0 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::tck_liveness::zg_ndfs::graph_t*>(&local_b8,this_00);
  syncprod::system_t::labels
            (&local_90,
             &(local_a0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_system_t,labels);
  algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::run
            (&local_70,&local_c1,
             local_b0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_c0,&local_90);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>.
  super__Head_base<1UL,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>,_false>.
  _M_head_impl.
  super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_c0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>.
  super__Head_base<1UL,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>,_false>.
  _M_head_impl.
  super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_b8._M_pi;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl._stored_states =
       local_70._stored_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl._cycle =
       local_70._cycle;
  *(undefined7 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
    ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.field_0x39 =
       local_70._57_7_;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_transitions_blue = local_70._visited_transitions_blue;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_transitions_red = local_70._visited_transitions_red;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_states_blue = local_70._visited_states_blue;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_states_red = local_70._visited_states_red;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.super_stats_t.
  _start_time.__d.__r = (rep)local_70.super_stats_t._start_time.__d.__r;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.super_stats_t.
  _end_time.__d.__r = (rep)local_70.super_stats_t._end_time.__d.__r;
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_90);
  if (bVar1) {
    if (local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
    if (local_b0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.
                 super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

std::tuple<tchecker::algorithms::ndfs::stats_t, std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>>
run(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & labels, std::size_t block_size,
    std::size_t table_size)
{
  std::shared_ptr<tchecker::ta::system_t const> system{new tchecker::ta::system_t{sysdecl}};
  if (!tchecker::system::every_process_has_initial_location(system->as_system_system()))
    std::cerr << tchecker::log_warning << "system has no initial state" << std::endl;

  std::shared_ptr<tchecker::zg::zg_t> zg{tchecker::zg::factory(system, tchecker::ts::SHARING, tchecker::zg::ELAPSED_SEMANTICS,
                                                               tchecker::zg::EXTRA_LU_PLUS_LOCAL, block_size, table_size)};

  std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> graph{
      new tchecker::tck_liveness::zg_ndfs::graph_t{zg, block_size, table_size}};

  boost::dynamic_bitset<> accepting_labels = system->as_syncprod_system().labels(labels);

  tchecker::tck_liveness::zg_ndfs::algorithm_t algorithm;

  tchecker::algorithms::ndfs::stats_t stats = algorithm.run(*zg, *graph, accepting_labels);

  return std::make_tuple(stats, graph);
}